

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colAlloc.c
# Opt level: O2

void PoolFreeEmptyPages(MemoryPool *pool)

{
  int *piVar1;
  Page *pacVar2;
  int iVar3;
  void *pvVar4;
  size_t sVar5;
  void *pvVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong uVar11;
  Page *pacVar12;
  AddressRange **ppAVar13;
  Page *page;
  ulong uVar14;
  Page *base;
  Page *pacVar15;
  ulong uVar16;
  
  pvVar4 = pthread_getspecific(tsdKey);
  sVar5 = systemPageSize;
  pool->nbPages = 0;
  pool->nbSetCells = 0;
  uVar7 = sVar5 >> 0xc;
  pacVar12 = (Page *)0x0;
  base = pool->pages;
  do {
    while( true ) {
      if (base == (Page *)0x0) {
        pool->lastPage = pacVar12;
        return;
      }
      uVar16 = 0;
      uVar14 = 0;
      pacVar15 = base;
      do {
        page = pacVar15;
        uVar14 = uVar14 + 1;
        sVar5 = NbSetCells(page);
        uVar16 = uVar16 + sVar5;
        pacVar15 = (Page *)(*(ulong *)*page & 0xffffffffffffff00);
      } while ((*(ulong *)*page & 0x20) == 0);
      if (uVar14 < uVar16) break;
      if (pacVar12 == (Page *)0x0) {
        pool->pages = pacVar15;
      }
      else {
        *(ulong *)*pacVar12 = (ulong)(byte)(*pacVar12)[0] | (ulong)pacVar15;
      }
      SysPageFree(base);
      base = pacVar15;
    }
    pacVar12 = page;
    if (-1 < *(char *)((long)*page + 0x1f)) {
      pvVar6 = pthread_getspecific(tsdKey);
      iVar3 = *(int *)((long)pvVar6 + 0x460);
      *(int *)((long)pvVar6 + 0x460) = iVar3 + 1;
      if (iVar3 == 0) {
        pthread_mutex_lock((pthread_mutex_t *)&mutexRange);
      }
      ppAVar13 = &ranges;
      do {
        ppAVar13 = &((AddressRange *)ppAVar13)->next->next;
        if ((AddressRange *)ppAVar13 == (AddressRange *)0x0) {
          pcVar10 = "Page not found";
          goto LAB_00106791;
        }
        pacVar2 = (Page *)((AddressRange *)ppAVar13)->base;
      } while ((base < pacVar2) ||
              ((Page *)((long)*pacVar2 +
                       (((AddressRange *)ppAVar13)->size << ((byte)shiftPage & 0x3f))) <= base));
      uVar11 = (long)base - (long)pacVar2 >> ((byte)shiftPage & 0x3f);
      uVar8 = (ulong)*(char *)((long)&((AddressRange *)((long)ppAVar13 + 0x28))->next + uVar11);
      if (uVar8 != 0xffffffffffffffff) {
        iVar3 = PlatFreePages((void *)((long)*base + systemPageSize),~uVar8);
        if (iVar3 == 0) {
          pcVar10 = "Page deallocation failed";
LAB_00106791:
          Col_Error(COL_FATAL,ColibriDomain,2,pcVar10);
        }
        else {
          *(undefined1 *)((long)&((AddressRange *)((long)ppAVar13 + 0x28))->next + uVar11) = 0xff;
          uVar9 = uVar11;
          while (uVar9 + 1 < uVar11 - uVar8) {
            *(undefined1 *)((long)&((AddressRange *)((long)ppAVar13 + 0x28))->next + uVar9 + 1) = 0;
            uVar9 = uVar9 + 1;
          }
          ((AddressRange *)ppAVar13)->free = ((AddressRange *)ppAVar13)->free + ~uVar8;
          if (uVar11 < ((AddressRange *)ppAVar13)->first) {
            ((AddressRange *)ppAVar13)->first = uVar11;
          }
        }
      }
      pvVar6 = pthread_getspecific(tsdKey);
      piVar1 = (int *)((long)pvVar6 + 0x460);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        pthread_mutex_unlock((pthread_mutex_t *)&mutexRange);
      }
      if (uVar14 < uVar7) {
        (*page)[0] = (*page)[0] & 0xdf;
        while( true ) {
          page = page + 1;
          if (uVar7 <= uVar14) break;
          *(ulong *)*pacVar12 = (ulong)(byte)(*pacVar12)[0] | (ulong)page & 0xffffffffffffff00;
          pacVar12[1][0] = (byte)pool->generation & 0xf;
          *(undefined8 *)(pacVar12[1] + 8) = *(undefined8 *)((long)pvVar4 + 8);
          ClearAllCells(pacVar12 + 1);
          uVar14 = uVar14 + 1;
          uVar16 = uVar16 + 1;
          pacVar12 = pacVar12 + 1;
        }
        *(ulong *)*pacVar12 = (ulong)pacVar15 | (ulong)(byte)(*pacVar12)[0] | 0x20;
        uVar14 = uVar7;
      }
    }
    pool->nbPages = pool->nbPages + uVar14;
    pool->nbSetCells = pool->nbSetCells + uVar16;
    base = pacVar15;
  } while( true );
}

Assistant:

void
PoolFreeEmptyPages(
    MemoryPool *pool)   /*!< Pool with pages to free. */
{
    ThreadData *data = PlatGetThreadData();
    Page *page, *base, *prev, *next;
    const size_t nbPagesPerSysPage = systemPageSize/PAGE_SIZE;
    size_t nbSetCells, nbPages, i;

    pool->nbPages = 0;
    pool->nbSetCells = 0;

    /*
     * Iterate over system pages...
     */

    for (prev = NULL, base = pool->pages; base; base = next) {
        /*
         * ... then over logical pages within the system page.
         */

        nbPages = 0;
        nbSetCells = 0;
        ASSERT(PAGE_FLAG(base, PAGE_FLAG_FIRST));
        for (page = base; ; page = PAGE_NEXT(page)) {
            nbPages++;
            nbSetCells += NbSetCells(page);
            if (PAGE_FLAG(page, PAGE_FLAG_LAST)) break;
        }
        next = PAGE_NEXT(page);
        if (nbSetCells > RESERVED_CELLS * nbPages) {
            /*
             * At least one page contains allocated cells.
             */

            if (!TestCell(page, CELLS_PER_PAGE-1)) {
                /*
                 * If there was a trailing large cell group, it is unused now.
                 */

                SysPageTrim(base);

                if (nbPages < nbPagesPerSysPage) {
                    /*
                     * Rebuild & relink logical pages that were used by the
                     * trailing cells.
                     */

                    PAGE_CLEAR_FLAG(page, PAGE_FLAG_LAST);
                    for (i = nbPages; i < nbPagesPerSysPage; i++) {
                        PAGE_SET_NEXT(page, page+1);
                        page++;

                        PAGE_SET_GENERATION(page, pool->generation);
                        PAGE_CLEAR_FLAG(page, PAGE_FLAGS_MASK);
                        PAGE_GROUPDATA(page) = data->groupData;

                        /* Initialize bit mask for allocated cells. */
                        ClearAllCells(page);

                        nbPages++;
                        nbSetCells++;
                    }
                    PAGE_SET_FLAG(page, PAGE_FLAG_LAST);
                    PAGE_SET_NEXT(page, next);
                }
            }
            prev = page;
            pool->nbPages += nbPages;
            pool->nbSetCells += nbSetCells;
        } else {
            /*
             * All logical pages in system page are empty.
             */

            if (prev) {
                /*
                 * Middle of list.
                 */

                PAGE_SET_NEXT(prev, next);
            } else {
                /*
                 * Head of list.
                 */

                pool->pages = next;
            }

            /*
             * Free the system page.
             */

            SysPageFree(base);
        }
    }
    ASSERT(!prev||!PAGE_NEXT(prev));
    pool->lastPage = prev;
}